

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

float trng::math::detail::Beta_I<float>(float x,float p,float q,float norm)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  if ((((1.0 < x) || (x < 0.0)) || (p <= 0.0)) || (q <= 0.0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x21;
    fVar6 = NAN;
  }
  else {
    fVar8 = p + q;
    fVar9 = 1.0 - x;
    fVar5 = fVar8 * x;
    fVar6 = x;
    fVar13 = p;
    if (p < fVar5) {
      fVar6 = fVar9;
      fVar9 = x;
      fVar13 = q;
      q = p;
    }
    iVar2 = (int)(fVar9 * fVar8 + q);
    fVar7 = fVar6;
    if (iVar2 != 0) {
      fVar7 = fVar6 / fVar9;
    }
    fVar10 = (fVar7 * (q + -1.0)) / (fVar13 + 1.0);
    fVar14 = fVar10 + 1.0;
    if ((4.7683716e-07 < ABS(fVar10)) || (fVar14 * 4.7683716e-07 < ABS(fVar10))) {
      fVar11 = 1.0;
      do {
        fVar11 = fVar11 + 1.0;
        if (iVar2 < 1) {
          fVar1 = fVar8 + 1.0;
          fVar12 = fVar8;
        }
        else {
          fVar1 = fVar8;
          fVar12 = q - fVar11;
          if (iVar2 == 1) {
            fVar7 = fVar6;
          }
        }
        fVar8 = fVar1;
        fVar10 = fVar10 * ((fVar12 * fVar7) / (fVar13 + fVar11));
        fVar14 = fVar14 + fVar10;
        iVar2 = iVar2 + -1;
      } while ((4.7683716e-07 < ABS(fVar10)) || (fVar14 * 4.7683716e-07 < ABS(fVar10)));
    }
    fVar6 = logf(fVar6);
    fVar9 = logf(fVar9);
    fVar6 = expf(fVar9 * (q + -1.0) + fVar6 * fVar13);
    fVar14 = ((fVar6 / fVar13) / norm) * fVar14;
    uVar4 = -(uint)(p < fVar5);
    fVar6 = (float)(uVar4 & (uint)(1.0 - fVar14) | ~uVar4 & (uint)fVar14);
  }
  return fVar6;
}

Assistant:

TRNG_CUDA_ENABLE T Beta_I(T x, T p, T q, T norm) {
        if (p <= 0 or q <= 0 or x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        const T eps{4 * numeric_limits<T>::epsilon()};
        T psq{p + q}, cx{1 - x};
        const bool flag{p < psq * x};
        if (flag) {
          // use  I(x, p, q) = 1 - I(1 - x, q, p)
          utility::swap(x, cx);
          utility::swap(p, q);
        }
        T term{1}, i{1}, y{1}, rx{x / cx}, temp{q - i};
        int s{static_cast<int>(q + cx * psq)};
        if (s == 0)
          rx = x;
        while (true) {
          term *= temp * rx / (p + i);
          y += term;
          temp = abs(term);
          if (temp <= eps and temp <= eps * y)
            break;
          ++i;
          --s;
          if (s >= 0) {
            temp = q - i;
            if (s == 0)
              rx = x;
          } else {
            temp = psq;
            psq++;
          }
        }
        y *= exp(p * ln(x) + (q - 1) * ln(cx)) / p / norm;
        return flag ? 1 - y : y;
      }